

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::lookupParameter
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Resolver *resolver,uint64_t scopeId,uint index)

{
  Reader brand;
  Reader source;
  size_t sVar1;
  BrandedDecl *t;
  BrandScope *this_00;
  Fault local_290;
  Fault f;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *p;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *_p342;
  CapTableReader *pCStack_270;
  void *local_268;
  WirePointer *pWStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  Reader local_248;
  ResolvedDecl local_218;
  undefined1 local_1b8 [128];
  BrandedDecl local_138;
  undefined1 local_90 [8];
  ResolvedDecl decl;
  uint index_local;
  uint64_t scopeId_local;
  Resolver *resolver_local;
  BrandScope *this_local;
  
  decl.brand.ptr.field_1._44_4_ = index;
  if (scopeId == this->leafId) {
    sVar1 = kj::Array<capnp::compiler::BrandedDecl>::size(&this->params);
    if (index < sVar1) {
      t = kj::Array<capnp::compiler::BrandedDecl>::operator[]
                    (&this->params,(ulong)(uint)decl.brand.ptr.field_1._44_4_);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,t);
    }
    else if ((this->inherited & 1U) == 0) {
      (*resolver->_vptr_Resolver[2])((ResolvedDecl *)local_90,resolver,0x1e);
      Resolver::ResolvedDecl::ResolvedDecl
                ((ResolvedDecl *)(local_1b8 + 0x20),(ResolvedDecl *)local_90);
      Resolver::ResolvedDecl::ResolvedDecl(&local_218,(ResolvedDecl *)local_90);
      List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::Reader(&local_248);
      brand.reader.capTable = local_248.reader.capTable;
      brand.reader.segment = local_248.reader.segment;
      brand.reader.ptr = local_248.reader.ptr;
      brand.reader.elementCount = local_248.reader.elementCount;
      brand.reader.step = local_248.reader.step;
      brand.reader.structDataSize = local_248.reader.structDataSize;
      brand.reader.structPointerCount = local_248.reader.structPointerCount;
      brand.reader.elementSize = local_248.reader.elementSize;
      brand.reader._39_1_ = local_248.reader._39_1_;
      brand.reader.nestingLimit = local_248.reader.nestingLimit;
      brand.reader._44_4_ = local_248.reader._44_4_;
      evaluateBrand((BrandScope *)local_1b8,(Resolver *)this,(ResolvedDecl *)resolver,brand,
                    (uint)&local_218);
      local_258._0_4_ = 0;
      local_258._4_2_ = 0;
      local_258._6_2_ = 0;
      uStack_250._0_4_ = 0;
      uStack_250._4_4_ = 0;
      local_268 = (void *)0x0;
      pWStack_260 = (WirePointer *)0x0;
      _p342 = (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)0x0;
      pCStack_270 = (CapTableReader *)0x0;
      Expression::Reader::Reader((Reader *)&_p342);
      source._reader.capTable = pCStack_270;
      source._reader.segment = (SegmentReader *)_p342;
      source._reader.data = local_268;
      source._reader.pointers = pWStack_260;
      source._reader.dataSize = (StructDataBitCount)local_258;
      source._reader.pointerCount = local_258._4_2_;
      source._reader._38_2_ = local_258._6_2_;
      source._reader.nestingLimit = (int)uStack_250;
      source._reader._44_4_ = uStack_250._4_4_;
      BrandedDecl::BrandedDecl
                (&local_138,(ResolvedDecl *)(local_1b8 + 0x20),
                 (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_1b8,source);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,&local_138);
      BrandedDecl::~BrandedDecl(&local_138);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_1b8);
      Resolver::ResolvedDecl::~ResolvedDecl(&local_218);
      Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)(local_1b8 + 0x20));
      Resolver::ResolvedDecl::~ResolvedDecl((ResolvedDecl *)local_90);
    }
    else {
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
    }
  }
  else {
    f.exception = (Exception *)
                  kj::_::readMaybe<capnp::compiler::BrandScope,decltype(nullptr)>(&this->parent);
    if (f.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                (&local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
                 ,0x159,FAILED,(char *)0x0,"\"scope is not a parent\"",
                 (char (*) [22])"scope is not a parent");
      kj::_::Debug::Fault::fatal(&local_290);
    }
    this_00 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::get
                        ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)f.exception);
    lookupParameter(__return_storage_ptr__,this_00,resolver,scopeId,decl.brand.ptr.field_1._44_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::lookupParameter(
    Resolver& resolver, uint64_t scopeId, uint index) {
  // Returns null if the param should be inherited from the client scope.

  if (scopeId == leafId) {
    if (index < params.size()) {
      return params[index];
    } else if (inherited) {
      return kj::none;
    } else {
      // Unbound and not inherited, so return AnyPointer.
      auto decl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
          Expression::Reader());
    }
  } else KJ_IF_SOME(p, parent) {
    return p.get()->lookupParameter(resolver, scopeId, index);
  } else {
    KJ_FAIL_REQUIRE("scope is not a parent");
  }
}